

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# COLLADASaxFWLKinematicsIntermediateData.h
# Opt level: O2

void __thiscall
COLLADASaxFWL::KinematicLink::addAttachment(KinematicLink *this,KinematicAttachment *attachement)

{
  KinematicAttachment *local_8;
  
  local_8 = attachement;
  std::
  vector<COLLADASaxFWL::KinematicAttachment_*,_std::allocator<COLLADASaxFWL::KinematicAttachment_*>_>
  ::push_back(&this->mAttachments,&local_8);
  return;
}

Assistant:

void addAttachment( KinematicAttachment* attachement ) { mAttachments.push_back(attachement); }